

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O1

void __thiscall CMU462::Camera::compute_position(Camera *this)

{
  Vector3D *pVVar1;
  Matrix3x3 *this_00;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar2 = sin(this->phi);
  if ((dVar2 == 0.0) && (!NAN(dVar2))) {
    dVar2 = this->phi + 9.999999747378752e-06;
    this->phi = dVar2;
    dVar2 = sin(dVar2);
  }
  dVar8 = this->r;
  dVar3 = sin(this->theta);
  dVar3 = dVar3 * dVar8 * dVar2;
  dVar8 = this->r;
  dVar4 = cos(this->phi);
  dVar4 = dVar4 * dVar8;
  dVar8 = this->r;
  dVar5 = cos(this->theta);
  dVar5 = dVar5 * dVar2 * dVar8;
  dVar8 = (this->targetPos).y;
  dVar9 = (this->targetPos).z;
  (this->pos).x = (this->targetPos).x + dVar3;
  (this->pos).y = dVar8 + dVar4;
  (this->pos).z = dVar9 + dVar5;
  dVar8 = *(double *)(&DAT_001df740 + (ulong)(0.0 < dVar2) * 8) * dVar5 + dVar4 * -0.0;
  dVar9 = dVar3 * 0.0 + dVar5 * -0.0;
  dVar10 = dVar4 * 0.0 - dVar3 * *(double *)(&DAT_001df740 + (ulong)(0.0 < dVar2) * 8);
  dVar2 = dVar10 * dVar10 + dVar8 * dVar8 + dVar9 * dVar9;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar2 = 1.0 / dVar2;
  dVar8 = dVar8 * dVar2;
  dVar9 = dVar9 * dVar2;
  dVar10 = dVar10 * dVar2;
  dVar11 = dVar4 * dVar10 - dVar9 * dVar5;
  dVar7 = dVar5 * dVar8 - dVar10 * dVar3;
  dVar6 = dVar3 * dVar9 - dVar8 * dVar4;
  dVar2 = dVar6 * dVar6 + dVar11 * dVar11 + dVar7 * dVar7;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar2 = 1.0 / dVar2;
  this_00 = &this->c2w;
  pVVar1 = Matrix3x3::operator[](this_00,0);
  pVVar1->x = dVar8;
  pVVar1->y = dVar9;
  pVVar1->z = dVar10;
  pVVar1 = Matrix3x3::operator[](this_00,1);
  pVVar1->x = dVar11 * dVar2;
  pVVar1->y = dVar7 * dVar2;
  pVVar1->z = dVar2 * dVar6;
  dVar2 = dVar5 * dVar5 + dVar3 * dVar3 + dVar4 * dVar4;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar2 = 1.0 / dVar2;
  pVVar1 = Matrix3x3::operator[](this_00,2);
  pVVar1->x = dVar3 * dVar2;
  pVVar1->y = dVar4 * dVar2;
  pVVar1->z = dVar5 * dVar2;
  return;
}

Assistant:

void Camera::compute_position() {
    double sinPhi = sin(phi);
    if (sinPhi == 0) {
      phi += EPS_F;
      sinPhi = sin(phi);
    }
    const Vector3D dirToCamera(r * sinPhi * sin(theta),
        r * cos(phi),
        r * sinPhi * cos(theta));
    pos = targetPos + dirToCamera;
    Vector3D upVec(0, sinPhi > 0 ? 1 : -1, 0);
    Vector3D screenXDir = cross(upVec, dirToCamera);
    screenXDir.normalize();
    Vector3D screenYDir = cross(dirToCamera, screenXDir);
    screenYDir.normalize();

    c2w[0] = screenXDir;
    c2w[1] = screenYDir;
    c2w[2] = dirToCamera.unit();   // camera's view direction is the
    // opposite of of dirToCamera, so
    // directly using dirToCamera as
    // column 2 of the matrix takes [0 0 -1]
    // to the world space view direction
  }